

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

int Wlc_ObjAlloc(Wlc_Ntk_t *p,int Type,int Signed,int End,int Beg)

{
  int iVar1;
  Wlc_Obj_t *p_00;
  Wlc_Obj_t *local_30;
  Wlc_Obj_t *pObj;
  int Beg_local;
  int End_local;
  int Signed_local;
  int Type_local;
  Wlc_Ntk_t *p_local;
  
  if ((Type != 2) && (Type != 4)) {
    if (p->iObj == p->nObjsAlloc) {
      if (p->pObjs == (Wlc_Obj_t *)0x0) {
        local_30 = (Wlc_Obj_t *)malloc((long)(p->nObjsAlloc << 1) * 0x18);
      }
      else {
        local_30 = (Wlc_Obj_t *)realloc(p->pObjs,(long)(p->nObjsAlloc << 1) * 0x18);
      }
      p->pObjs = local_30;
      memset(p->pObjs + p->nObjsAlloc,0,(long)p->nObjsAlloc * 0x18);
      p->nObjsAlloc = p->nObjsAlloc << 1;
    }
    p_00 = Wlc_NtkObj(p,p->iObj);
    *(ushort *)p_00 = *(ushort *)p_00 & 0xffc0 | (ushort)Type & 0x3f;
    *(ushort *)p_00 = *(ushort *)p_00 & 0xffbf | ((ushort)Signed & 1) << 6;
    p_00->End = End;
    p_00->Beg = Beg;
    iVar1 = Wlc_ObjIsCi(p_00);
    if (iVar1 != 0) {
      Wlc_ObjSetCi(p,p_00);
    }
    p->nObjs[Type] = p->nObjs[Type] + 1;
    iVar1 = p->iObj;
    p->iObj = iVar1 + 1;
    return iVar1;
  }
  __assert_fail("Type != WLC_OBJ_PO && Type != WLC_OBJ_FI",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNtk.c"
                ,0xca,"int Wlc_ObjAlloc(Wlc_Ntk_t *, int, int, int, int)");
}

Assistant:

int Wlc_ObjAlloc( Wlc_Ntk_t * p, int Type, int Signed, int End, int Beg )
{
    Wlc_Obj_t * pObj;
    assert( Type != WLC_OBJ_PO && Type != WLC_OBJ_FI );
    if ( p->iObj == p->nObjsAlloc )
    {
        p->pObjs = ABC_REALLOC( Wlc_Obj_t, p->pObjs, 2 * p->nObjsAlloc );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Wlc_Obj_t) * p->nObjsAlloc );
        p->nObjsAlloc *= 2;
    }
    pObj = Wlc_NtkObj( p, p->iObj );
    pObj->Type   = Type;
    pObj->Signed = Signed;
    pObj->End    = End;
    pObj->Beg    = Beg;
    if ( Wlc_ObjIsCi(pObj) )
        Wlc_ObjSetCi( p, pObj );
    p->nObjs[Type]++;
    return p->iObj++;
}